

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_Test::
~TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_Test
          (TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_Test *this)

{
  TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_Test *this_local;
  
  ~TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MemoryLeakDetectorListTest, clearAllAccountingIsWorkingProperly)
{
    MemoryLeakDetectorList listForTesting;
    MemoryLeakDetectorNode node1, node2, node3;
    node3.period_ = mem_leak_period_disabled;
    listForTesting.addNewNode(&node1);
    listForTesting.addNewNode(&node2);
    listForTesting.addNewNode(&node3);

    listForTesting.clearAllAccounting(mem_leak_period_enabled);

    POINTERS_EQUAL(NULLPTR, listForTesting.getFirstLeak(mem_leak_period_enabled));
    CHECK(&node3 == listForTesting.getFirstLeak(mem_leak_period_disabled));
}